

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::AvoidCompensationConflicts
          (LinearScan *this,LabelInstr *labelInstr,BranchInstr *branchInstr,
          Lifetime **labelRegContent,Lifetime **branchRegContent,Instr **pInsertionInstr,
          Instr **pInsertionStartInstr,bool needsAirlock,bool *pHasAirlock)

{
  IRType type;
  RegNum reg;
  Lifetime *pLVar1;
  bool bVar2;
  bool bVar3;
  uint32 number;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  Instr *instr;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  LabelInstr *pLVar7;
  uint index;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  RegNum aRStack_98 [8];
  RegNum conflictRegs [33];
  
  unique0x100002bf = branchInstr;
  do {
    conflictRegs[8] = RegNOREG;
    conflictRegs[9] = RegNOREG;
    conflictRegs[10] = RegNOREG;
    conflictRegs[0xb] = RegNOREG;
    conflictRegs[0xc] = RegNOREG;
    conflictRegs[0xd] = RegNOREG;
    conflictRegs[0xe] = RegNOREG;
    conflictRegs[0xf] = RegNOREG;
    conflictRegs[0x10] = RegNOREG;
    conflictRegs[0x11] = RegNOREG;
    conflictRegs[0x12] = RegNOREG;
    conflictRegs[0x13] = RegNOREG;
    conflictRegs[0x14] = RegNOREG;
    conflictRegs[0x15] = RegNOREG;
    conflictRegs[0x16] = RegNOREG;
    conflictRegs[0x17] = RegNOREG;
    aRStack_98[0] = RegNOREG;
    aRStack_98[1] = RegNOREG;
    aRStack_98[2] = RegNOREG;
    aRStack_98[3] = RegNOREG;
    aRStack_98[4] = RegNOREG;
    aRStack_98[5] = RegNOREG;
    aRStack_98[6] = RegNOREG;
    aRStack_98[7] = RegNOREG;
    conflictRegs[0] = RegNOREG;
    conflictRegs[1] = RegNOREG;
    conflictRegs[2] = RegNOREG;
    conflictRegs[3] = RegNOREG;
    conflictRegs[4] = RegNOREG;
    conflictRegs[5] = RegNOREG;
    conflictRegs[6] = RegNOREG;
    conflictRegs[7] = RegNOREG;
    conflictRegs[0x18] = RegNOREG;
    uVar9 = (this->secondChanceRegs).word;
    if (uVar9 == 0) {
      return;
    }
    uVar8 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    bVar2 = false;
    do {
      index = (uint)uVar8;
      BVUnitT<unsigned_long>::AssertRange(index);
      uVar10 = uVar8 & 0xffffffff;
      pLVar1 = branchRegContent[uVar10];
      if (pLVar1 != labelRegContent[uVar10]) {
        type = RegTypes[uVar10];
        bVar3 = IRType_IsFloat(type);
        if ((!bVar3) && (bVar3 = NeedsLoopBackEdgeCompensation(this,pLVar1,labelInstr), bVar3)) {
          pLVar7 = (LabelInstr *)*pInsertionInstr;
          if ((needsAirlock) && (*pHasAirlock == false)) {
            InsertAirlock(this,stack0xffffffffffffff90,labelInstr);
            *pInsertionStartInstr = (labelInstr->super_Instr).m_prev;
            *pHasAirlock = true;
            pLVar7 = labelInstr;
          }
          *pInsertionInstr = &pLVar7->super_Instr;
          reg = conflictRegs[uVar10 - 8];
          uVar4 = (ulong)reg;
          if (uVar4 != 0) {
            dstOpnd = IR::RegOpnd::New(branchRegContent[uVar10]->sym,(RegNum)uVar8,type,this->func);
            src2Opnd = IR::RegOpnd::New(branchRegContent[uVar10]->sym,reg,type,this->func);
            instr = IR::Instr::New(XCHG,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,
                                   &src2Opnd->super_Opnd,this->func);
            IR::Instr::InsertBefore(*pInsertionInstr,instr);
            number = IR::Instr::GetNumber(*pInsertionInstr);
            IR::Instr::SetNumber(instr,number);
            pLVar1 = branchRegContent[uVar10];
            branchRegContent[uVar10] = branchRegContent[uVar4];
            branchRegContent[uVar4] = pLVar1;
            bVar2 = true;
            index = (uint)reg;
          }
          lVar6 = 0;
          do {
            if (labelRegContent[lVar6 + 1] == branchRegContent[index]) {
              bVar5 = (char)lVar6 + 1;
              goto LAB_005908df;
            }
            lVar6 = lVar6 + 1;
          } while ((char)lVar6 != '\x10');
          bVar5 = 0;
LAB_005908df:
          if (bVar5 != 0) {
            conflictRegs[(ulong)bVar5 - 8] = (RegNum)index;
          }
        }
      }
      uVar9 = uVar9 & ~(1L << (uVar8 & 0x3f));
      lVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar8 = (ulong)(-(uint)(uVar9 == 0) | (uint)lVar6);
    } while (uVar9 != 0);
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void LinearScan::AvoidCompensationConflicts(IR::LabelInstr *labelInstr, IR::BranchInstr *branchInstr,
                                            Lifetime *labelRegContent[], Lifetime *branchRegContent[],
                                            IR::Instr **pInsertionInstr, IR::Instr **pInsertionStartInstr, bool needsAirlock, bool *pHasAirlock)
{
    bool changed = true;

    // Look for conflicts in the incoming compensation code:
    //      MOV     ESI, EAX
    //      MOV     ECX, ESI    <<  ESI was lost...
    // Using XCHG:
    //      XCHG    ESI, EAX
    //      MOV     ECX, EAX
    //
    // Note that we need to iterate while(changed) to catch all conflicts
    while(changed) {
        RegNum conflictRegs[RegNumCount] = {RegNOREG};
        changed = false;

        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // We don't have an XCHG for SSE2 regs
            if (lifetime == labelLifetime || IRType_IsFloat(RegTypes[reg]))
            {
                continue;
            }

            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                *pInsertionInstr = this->EnsureAirlock(needsAirlock, pHasAirlock, *pInsertionInstr, pInsertionStartInstr, branchInstr, labelInstr);

                if (conflictRegs[reg] != RegNOREG)
                {
                    // Eliminate conflict with an XCHG
                    IR::RegOpnd *reg1 = IR::RegOpnd::New(branchRegContent[reg]->sym, (RegNum)reg, RegTypes[reg], this->func);
                    IR::RegOpnd *reg2 = IR::RegOpnd::New(branchRegContent[reg]->sym, conflictRegs[reg], RegTypes[reg], this->func);
                    IR::Instr *instrXchg = IR::Instr::New(Js::OpCode::XCHG, reg1, reg1, reg2, this->func);
                    (*pInsertionInstr)->InsertBefore(instrXchg);
                    instrXchg->CopyNumber(*pInsertionInstr);

                    Lifetime *tmpLifetime = branchRegContent[reg];
                    branchRegContent[reg] = branchRegContent[conflictRegs[reg]];
                    branchRegContent[conflictRegs[reg]] = tmpLifetime;
                    reg = conflictRegs[reg];

                    changed = true;
                }
                RegNum labelReg = RegNOREG;
                FOREACH_INT_REG(regIter)
                {
                    if (labelRegContent[regIter] == branchRegContent[reg])
                    {
                        labelReg = regIter;
                        break;
                    }
                } NEXT_INT_REG;

                if (labelReg != RegNOREG)
                {
                    conflictRegs[labelReg] = (RegNum)reg;
                }
            }
        } NEXT_BITSET_IN_UNITBV;
    }
}